

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_MapEntryValueName_Test::TestBody
          (ValidationErrorTest_MapEntryValueName_Test *this)

{
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar2;
  Arena *arena;
  string_view value;
  FileDescriptorProto file_proto;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  undefined1 local_108 [248];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_108,(Arena *)0x0);
  anon_unknown_532::FillValidMapEntry((FileDescriptorProto *)local_108);
  pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     ((RepeatedPtrFieldBase *)(local_108 + 0x30),0);
  pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (&(pVVar1->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,0);
  pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                     (&(pVVar1->field_0)._impl_.field_.super_RepeatedPtrFieldBase,1);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  arena = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  value._M_str = "Value";
  value._M_len = 5;
  protobuf::internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.name_,value,arena);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_120,
            "foo.proto: Foo.foo_map: TYPE: map_entry should not be set explicitly. Use map<KeyType, ValueType> instead.\n"
           );
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,(FileDescriptorProto *)local_108,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_120);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_120);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_108);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, MapEntryValueName) {
  FileDescriptorProto file_proto;
  FillValidMapEntry(&file_proto);
  FieldDescriptorProto* value =
      file_proto.mutable_message_type(0)->mutable_nested_type(0)->mutable_field(
          1);
  value->set_name("Value");
  BuildFileWithErrors(file_proto, kMapEntryErrorMessage);
}